

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

void __thiscall
TTD::FileReader::FileReader
          (FileReader *this,JsTTDStreamHandle handle,TTDReadBytesFromStreamCallback pfRead,
          TTDFlushAndCloseStreamCallback pfClose)

{
  Memory *this_00;
  uchar *puVar1;
  TrackAllocData local_50;
  TTDFlushAndCloseStreamCallback local_28;
  TTDFlushAndCloseStreamCallback pfClose_local;
  TTDReadBytesFromStreamCallback pfRead_local;
  JsTTDStreamHandle handle_local;
  FileReader *this_local;
  
  this->_vptr_FileReader = (_func_int **)&PTR__FileReader_01def9e0;
  this->m_hfile = handle;
  this->m_pfRead = pfRead;
  this->m_pfClose = pfClose;
  this->m_peekChar = -1;
  this->m_cursor = 0;
  this->m_buffCount = 0;
  this->m_buffer = (byte *)0x0;
  local_28 = pfClose;
  pfClose_local = (TTDFlushAndCloseStreamCallback)pfRead;
  pfRead_local = (TTDReadBytesFromStreamCallback)handle;
  handle_local = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&unsigned_char::typeinfo,0,0x200000,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTSerialize.cpp"
             ,0x25f);
  this_00 = (Memory *)
            Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_50);
  puVar1 = Memory::AllocateArray<Memory::HeapAllocator,unsigned_char,true>
                     (this_00,(HeapAllocator *)Memory::HeapAllocator::NoThrowAlloc,0,0x200000);
  puVar1 = TTD_MEM_ALLOC_CHECK<unsigned_char>(puVar1);
  this->m_buffer = puVar1;
  return;
}

Assistant:

FileReader::FileReader(JsTTDStreamHandle handle, TTDReadBytesFromStreamCallback pfRead, TTDFlushAndCloseStreamCallback pfClose)
        : m_hfile(handle), m_pfRead(pfRead), m_pfClose(pfClose), m_peekChar(-1), m_cursor(0), m_buffCount(0), m_buffer(nullptr)
    {
        this->m_buffer = TT_HEAP_ALLOC_ARRAY(byte, TTD_SERIALIZATION_BUFFER_SIZE);
    }